

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void VW::setup_example(vw *all,example *ae)

{
  unsigned_long *puVar1;
  byte *pbVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint32_t uVar6;
  uchar **ppuVar7;
  byte *__src;
  size_type sVar8;
  example_predict *this;
  features *pfVar9;
  unsigned_long **ppuVar10;
  features *pfVar11;
  size_t sVar12;
  v_array<unsigned_char> *in_RSI;
  long in_RDI;
  undefined4 uVar13;
  float new_features_sum_feat_sq;
  size_t new_features_cnt;
  features *fs_1;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  unsigned_long *j;
  unsigned_long *__end3;
  unsigned_long *__begin3;
  v_array<unsigned_long> *__range3;
  features *fs;
  iterator __end2;
  iterator __begin2;
  example *__range2;
  uint64_t multiplier;
  uchar *i;
  example *in_stack_ffffffffffffff18;
  features *in_stack_ffffffffffffff20;
  uint32_t local_c0;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint32_t after;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar14;
  float in_stack_ffffffffffffff54;
  example **in_stack_ffffffffffffff58;
  vw *in_stack_ffffffffffffff60;
  iterator local_98;
  features *local_88;
  example *in_stack_ffffffffffffff88;
  io_buf *in_stack_ffffffffffffff90;
  unsigned_long *local_60;
  iterator local_48;
  iterator local_38;
  v_array<unsigned_char> *local_28;
  long local_20;
  byte *local_18;
  v_array<unsigned_char> *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pfVar9 = local_88;
  if (((*(byte *)(*(long *)(in_RDI + 8) + 0x219) & 1) != 0) &&
     (((ulong)in_RSI[0x346]._end & 0x10000) == 0)) {
    unique_sort_features
              (CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (example *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  if ((*(byte *)(*(long *)(local_8 + 8) + 0x218) & 1) != 0) {
    (**(code **)(*(long *)(local_8 + 8) + 0x348))
              (&local_10[0x341]._end,*(undefined8 *)(*(long *)(local_8 + 8) + 0x210));
    cache_features(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(uint64_t)pfVar9);
  }
  *(undefined4 *)&local_10[0x345]._end = 0;
  local_10[0x345]._begin = (uchar *)0x0;
  *(undefined4 *)((long)&local_10[0x345].end_array + 4) = 0;
  *(undefined4 *)&local_10[0x345].end_array = 0;
  local_10[0x344].erase_count = *(size_t *)(*(long *)(local_8 + 8) + 0x230);
  if ((*(byte *)(*(long *)(local_8 + 8) + 0x23c) & 1) == 0) {
    *(int *)(*(long *)(local_8 + 8) + 0x238) = *(int *)(*(long *)(local_8 + 8) + 0x238) + 1;
  }
  uVar6 = *(uint32_t *)(local_8 + 0x345c);
  after = *(uint32_t *)(local_8 + 0x3460);
  uVar14 = CONCAT13(*(byte *)(local_8 + 0x3457),(int3)in_stack_ffffffffffffff50);
  if ((*(byte *)(*(long *)(local_8 + 8) + 0x23c) & 1) == 0) {
    local_c0 = 0;
  }
  else {
    local_c0 = *(int *)(local_8 + 0x345c) - 1;
  }
  bVar3 = is_test_only(*(uint32_t *)(*(long *)(local_8 + 8) + 0x238),uVar6,after,
                       (bool)(*(byte *)(local_8 + 0x3457) & 1),local_c0);
  *(bool *)&local_10[0x346]._end = bVar3;
  bVar4 = (**(code **)(*(long *)(local_8 + 8) + 0x370))(&local_10[0x341]._end);
  *(bool *)&local_10[0x346]._end = ((ulong)local_10[0x346]._end & 1) != 0 || (bVar4 & 1) != 0;
  if (((*(byte *)(*(long *)(local_8 + 8) + 0x23c) & 1) != 0) &&
     (iVar5 = example_is_newline(in_stack_ffffffffffffff18), iVar5 != 0)) {
    *(int *)(*(long *)(local_8 + 8) + 0x238) = *(int *)(*(long *)(local_8 + 8) + 0x238) + 1;
  }
  uVar13 = (**(code **)(*(long *)(local_8 + 8) + 0x360))(&local_10[0x341]._end);
  *(undefined4 *)&local_10[0x343].end_array = uVar13;
  if ((*(byte *)(local_8 + 0x3b0) & 1) != 0) {
    ppuVar7 = v_array<unsigned_char>::begin(local_10);
    for (local_18 = *ppuVar7; pbVar2 = local_18, ppuVar7 = v_array<unsigned_char>::end(local_10),
        pbVar2 != *ppuVar7; local_18 = local_18 + 1) {
      if ((*(byte *)(local_8 + 0x3b1 + (ulong)*local_18) & 1) != 0) {
        features::clear(in_stack_ffffffffffffff20);
        pbVar2 = local_18;
        __src = local_18 + 1;
        ppuVar7 = v_array<unsigned_char>::end(local_10);
        memmove(pbVar2,__src,(long)*ppuVar7 - (long)(local_18 + 1));
        ppuVar7 = v_array<unsigned_char>::end(local_10);
        *ppuVar7 = *ppuVar7 + -1;
        local_18 = local_18 + -1;
      }
    }
  }
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_8 + 0x6b8));
  if (sVar8 != 0) {
    generateGrams(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  if ((*(byte *)(local_8 + 0x3454) & 1) != 0) {
    add_constant_feature
              ((vw *)CONCAT44(in_stack_ffffffffffffff54,uVar14),(example *)CONCAT44(after,uVar6));
  }
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_8 + 0xee8));
  if (sVar8 != 0) {
    feature_limit((vw *)CONCAT44(in_stack_ffffffffffffff54,uVar14),(example *)CONCAT44(after,uVar6))
    ;
  }
  this = (example_predict *)(ulong)*(uint *)(local_8 + 0x288);
  uVar6 = parameters::stride_shift((parameters *)in_stack_ffffffffffffff18);
  local_20 = (long)this << ((byte)uVar6 & 0x3f);
  if (local_20 != 1) {
    local_28 = local_10;
    local_38 = example_predict::begin(this);
    local_48 = example_predict::end(this);
    while (bVar3 = example_predict::iterator::operator!=(&local_38,&local_48), bVar3) {
      pfVar9 = example_predict::iterator::operator*(&local_38);
      ppuVar10 = v_array<unsigned_long>::begin(&pfVar9->indicies);
      local_60 = *ppuVar10;
      ppuVar10 = v_array<unsigned_long>::end(&pfVar9->indicies);
      puVar1 = *ppuVar10;
      for (; local_60 != puVar1; local_60 = local_60 + 1) {
        *local_60 = local_20 * *local_60;
      }
      example_predict::iterator::operator++(&local_38);
    }
  }
  local_10[0x345]._begin = (uchar *)0x0;
  *(undefined4 *)((long)&local_10[0x345].end_array + 4) = 0;
  _local_88 = example_predict::begin(this);
  local_98 = example_predict::end(this);
  while (bVar3 = example_predict::iterator::operator!=((iterator *)&local_88,&local_98), bVar3) {
    pfVar11 = example_predict::iterator::operator*((iterator *)&local_88);
    sVar12 = features::size((features *)0x2f477b);
    local_10[0x345]._begin = local_10[0x345]._begin + sVar12;
    *(float *)((long)&local_10[0x345].end_array + 4) =
         pfVar11->sum_feat_sq + *(float *)((long)&local_10[0x345].end_array + 4);
    example_predict::iterator::operator++((iterator *)&local_88);
  }
  INTERACTIONS::eval_count_of_generated_ft
            ((vw *)__begin2._feature_space,(example *)__end2._index,(size_t *)__end2._feature_space,
             (float *)fs);
  local_10[0x345]._begin = (uchar *)((long)in_stack_ffffffffffffff58 + (long)local_10[0x345]._begin)
  ;
  *(float *)((long)&local_10[0x345].end_array + 4) =
       in_stack_ffffffffffffff54 + *(float *)((long)&local_10[0x345].end_array + 4);
  return;
}

Assistant:

void setup_example(vw& all, example* ae)
{
  if (all.p->sort_features && ae->sorted == false)
    unique_sort_features(all.parse_mask, ae);

  if (all.p->write_cache)
  {
    all.p->lp.cache_label(&ae->l, *(all.p->output));
    cache_features(*(all.p->output), ae, all.parse_mask);
  }

  ae->partial_prediction = 0.;
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0;
  ae->loss = 0.;

  ae->example_counter = (size_t)(all.p->end_parsed_examples);
  if (!all.p->emptylines_separate_examples)
    all.p->in_pass_counter++;

  ae->test_only = is_test_only(all.p->in_pass_counter, all.holdout_period, all.holdout_after, all.holdout_set_off,
      all.p->emptylines_separate_examples ? (all.holdout_period - 1) : 0);
  ae->test_only |= all.p->lp.test_label(&ae->l);

  if (all.p->emptylines_separate_examples && example_is_newline(*ae))
    all.p->in_pass_counter++;

  ae->weight = all.p->lp.get_weight(&ae->l);

  if (all.ignore_some)
    for (unsigned char* i = ae->indices.begin(); i != ae->indices.end(); i++)
      if (all.ignore[*i])
      {
        // delete namespace
        ae->feature_space[*i].clear();
        memmove(i, i + 1, (ae->indices.end() - (i + 1)) * sizeof(*i));
        ae->indices.end()--;
        i--;
      }

  if (all.ngram_strings.size() > 0)
    generateGrams(all, ae);

  if (all.add_constant)  // add constant feature
    VW::add_constant_feature(all, ae);

  if (all.limit_strings.size() > 0)
    feature_limit(all, ae);

  uint64_t multiplier = (uint64_t)all.wpp << all.weights.stride_shift();

  if (multiplier != 1)  // make room for per-feature information.
    for (features& fs : *ae)
      for (auto& j : fs.indicies) j *= multiplier;
  ae->num_features = 0;
  ae->total_sum_feat_sq = 0;
  for (features& fs : *ae)
  {
    ae->num_features += fs.size();
    ae->total_sum_feat_sq += fs.sum_feat_sq;
  }

  size_t new_features_cnt;
  float new_features_sum_feat_sq;
  INTERACTIONS::eval_count_of_generated_ft(all, *ae, new_features_cnt, new_features_sum_feat_sq);
  ae->num_features += new_features_cnt;
  ae->total_sum_feat_sq += new_features_sum_feat_sq;
}